

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_getfield(lua_State *L,int idx,char *k)

{
  TValue *pTVar1;
  size_t lenx;
  GCstr *pGVar2;
  cTValue *pcVar3;
  cTValue *pcVar4;
  TValue key;
  
  pTVar1 = index2adr(L,idx);
  lenx = strlen(k);
  pGVar2 = lj_str_new(L,k,lenx);
  key.u64 = (ulong)pGVar2 | 0xfffd800000000000;
  pcVar3 = lj_meta_tget(L,pTVar1,&key);
  pcVar4 = L->top;
  if (pcVar3 == (cTValue *)0x0) {
    L->top = pcVar4 + 2;
    lj_vm_call(L,pcVar4,2);
    pTVar1 = L->top;
    pcVar4 = pTVar1 + -3;
    L->top = pcVar4;
    pcVar3 = pTVar1 + -1;
  }
  *pcVar4 = *pcVar3;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_getfield(lua_State *L, int idx, const char *k)
{
  cTValue *v, *t = index2adr_check(L, idx);
  TValue key;
  setstrV(L, &key, lj_str_newz(L, k));
  v = lj_meta_tget(L, t, &key);
  if (v == NULL) {
    L->top += 2;
    lj_vm_call(L, L->top-2, 1+1);
    L->top -= 2+LJ_FR2;
    v = L->top+1+LJ_FR2;
  }
  copyTV(L, L->top, v);
  incr_top(L);
}